

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O3

int file_read(BIO *b,char *out,int outl)

{
  int iVar1;
  size_t sVar2;
  
  if (b->init == 0) {
    sVar2 = 0;
  }
  else {
    sVar2 = fread(out,1,(long)outl,(FILE *)b->ptr);
    if (sVar2 == 0) {
      iVar1 = ferror((FILE *)b->ptr);
      if (iVar1 != 0) {
        ERR_put_error(2,0,0,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/file.cc"
                      ,0x77);
        ERR_put_error(0x11,0,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/file.cc"
                      ,0x78);
        sVar2 = 0xffffffff;
      }
    }
  }
  return (int)sVar2;
}

Assistant:

static int file_read(BIO *b, char *out, int outl) {
  if (!b->init) {
    return 0;
  }

  size_t ret = fread(out, 1, outl, (FILE *)b->ptr);
  if (ret == 0 && ferror((FILE *)b->ptr)) {
    OPENSSL_PUT_SYSTEM_ERROR();
    OPENSSL_PUT_ERROR(BIO, ERR_R_SYS_LIB);
    return -1;
  }

  // fread reads at most |outl| bytes, so |ret| fits in an int.
  return (int)ret;
}